

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDebugNames::ValueIterator::searchFromStartOfCurrentIndex(ValueIterator *this)

{
  bool bVar1;
  const_iterator pNVar2;
  NameIndex *End;
  ValueIterator *this_local;
  
  pNVar2 = SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>::end
                     ((SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void> *)
                      &this->CurrentIndex->Section->NameIndices);
  while( true ) {
    if (this->CurrentIndex == pNVar2) {
      setEnd(this);
      return;
    }
    bVar1 = findInCurrentIndex(this);
    if (bVar1) break;
    this->CurrentIndex = this->CurrentIndex + 1;
  }
  return;
}

Assistant:

void DWARFDebugNames::ValueIterator::searchFromStartOfCurrentIndex() {
  for (const NameIndex *End = CurrentIndex->Section.NameIndices.end();
       CurrentIndex != End; ++CurrentIndex) {
    if (findInCurrentIndex())
      return;
  }
  setEnd();
}